

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

string * __thiscall
helics::helicsDoubleString_abi_cxx11_(string *__return_storage_ptr__,helics *this,double val)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  string_view fmt;
  double local_18 [2];
  
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_18;
  fmt.size_ = 10;
  fmt.data_ = (char *)0x2;
  local_18[0] = val;
  ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x44bc06,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string helicsDoubleString(double val)
{
    return fmt::format("{}", val);
}